

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreFilter.hpp
# Opt level: O2

Range __thiscall cppjieba::PreFilter::Next(PreFilter *this)

{
  const_iterator pRVar1;
  bool bVar2;
  const_iterator pRVar3;
  const_iterator key;
  Range RVar4;
  
  pRVar1 = this->cursor_;
  key = pRVar1;
  do {
    pRVar3 = (this->sentence_).ptr_ + (this->sentence_).size_;
    if (key == pRVar3) {
LAB_00109700:
      RVar4.end = pRVar3;
      RVar4.begin = pRVar1;
      return RVar4;
    }
    bVar2 = std::
            IsIn<unsigned_int,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                      (this->symbols_,&key->rune);
    pRVar3 = this->cursor_;
    if (bVar2) {
      if (pRVar1 == pRVar3) {
        pRVar3 = pRVar3 + 1;
        this->cursor_ = pRVar3;
      }
      goto LAB_00109700;
    }
    key = pRVar3 + 1;
    this->cursor_ = key;
  } while( true );
}

Assistant:

Range Next() {
    Range range;
    range.begin = cursor_;
    while (cursor_ != sentence_.end()) {
      if (IsIn(symbols_, cursor_->rune)) {
        if (range.begin == cursor_) {
          cursor_ ++;
        }
        range.end = cursor_;
        return range;
      }
      cursor_ ++;
    }
    range.end = sentence_.end();
    return range;
  }